

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

QSize __thiscall
QDockWidgetLayout::sizeFromContent(QDockWidgetLayout *this,QSize *content,bool floating)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QWidget *pQVar5;
  QStyle *pQVar6;
  QSize QVar7;
  QSize QVar8;
  int iVar9;
  Representation RVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  Representation RVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  QMargins QVar27;
  int local_40;
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  QVar7 = *content;
  RVar10 = QVar7.ht.m_i;
  if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
    iVar3 = minimumTitleWidth(this);
    RVar15.m_i = RVar10.m_i;
    if (RVar10.m_i < iVar3) {
      RVar15.m_i = iVar3;
    }
    iVar3 = (content->wd).m_i;
    local_40 = 0;
    if (0 < iVar3) {
      local_40 = iVar3;
    }
  }
  else {
    RVar15.m_i = 0;
    if (RVar10.m_i != 0 && -1 < (long)QVar7) {
      RVar15.m_i = RVar10.m_i;
    }
    local_40 = minimumTitleWidth(this);
    if (local_40 < QVar7.wd.m_i.m_i) {
      local_40 = QVar7.wd.m_i.m_i;
    }
  }
  pQVar5 = QLayout::parentWidget(&this->super_QLayout);
  pQVar5 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&pQVar5->super_QObject)->
            super_QWidget;
  bVar2 = nativeWindowDeco(this,floating);
  iVar3 = 0;
  if (floating && !bVar2) {
    pQVar6 = QWidget::style(pQVar5);
    iVar3 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x12,0,pQVar5);
    iVar3 = iVar3 * 2;
  }
  iVar4 = titleHeight(this);
  if (!bVar2) {
    local_40 = local_40 + iVar3;
    if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
      local_40 = local_40 + iVar4;
      RVar15.m_i = iVar3 + RVar15.m_i;
    }
    else {
      RVar15.m_i = iVar3 + RVar15.m_i + iVar4;
    }
  }
  iVar3 = (content->wd).m_i;
  iVar4 = (content->ht).m_i;
  QVar27 = QWidget::contentsMargins(pQVar5);
  QVar7 = QWidget::minimumSize(pQVar5);
  QVar8 = QWidget::maximumSize(pQVar5);
  lVar1 = *(long *)(*(long *)&pQVar5->field_0x8 + 0x78);
  iVar11 = 0xffffff;
  iVar9 = -1;
  iVar12 = 0xffffff;
  iVar16 = iVar9;
  iVar13 = iVar9;
  if (lVar1 != 0) {
    iVar13 = QVar27.m_left.m_i.m_i + QVar27.m_right.m_i.m_i;
    iVar11 = QVar8.wd.m_i.m_i - iVar13;
    iVar17 = QVar27.m_top.m_i.m_i + QVar27.m_bottom.m_i.m_i;
    iVar16 = QVar7.wd.m_i.m_i - iVar13;
    auVar18 = ZEXT416(*(uint *)(lVar1 + 0x7c));
    auVar18 = pshuflw(auVar18,auVar18,0);
    auVar22 = ZEXT816(0x1000200040008);
    auVar26._0_12_ = auVar22._0_12_;
    auVar26._12_2_ = auVar22._6_2_;
    auVar26._14_2_ = auVar22._6_2_;
    auVar25._12_4_ = auVar26._12_4_;
    auVar25._0_10_ = auVar22._0_10_;
    auVar25._10_2_ = auVar22._4_2_;
    auVar24._10_6_ = auVar25._10_6_;
    auVar24._8_2_ = auVar22._4_2_;
    auVar24._0_8_ = 0x1000200040008;
    auVar23._8_8_ = auVar24._8_8_;
    auVar23._6_2_ = auVar22._2_2_;
    auVar23._4_2_ = auVar22._2_2_;
    auVar23._0_2_ = auVar22._0_2_;
    auVar23._2_2_ = auVar23._0_2_;
    auVar20._0_12_ = auVar18._0_12_;
    auVar20._12_2_ = auVar18._6_2_;
    auVar20._14_2_ = auVar18._6_2_;
    auVar19._12_4_ = auVar20._12_4_;
    auVar19._0_10_ = auVar18._0_10_;
    auVar19._10_2_ = auVar18._4_2_;
    auVar22._10_6_ = auVar19._10_6_;
    auVar22._0_8_ = auVar18._0_8_;
    auVar22._8_2_ = auVar18._4_2_;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._6_2_ = auVar18._2_2_;
    auVar21._4_2_ = auVar18._2_2_;
    auVar21._0_2_ = auVar18._0_2_;
    auVar21._2_2_ = auVar21._0_2_;
    auVar21 = auVar21 & auVar23;
    auVar18._0_2_ = -(ushort)(auVar21._0_2_ == 0);
    auVar18._2_2_ = -(ushort)(auVar21._2_2_ == 0);
    auVar18._4_2_ = -(ushort)(auVar21._4_2_ == 0);
    auVar18._6_2_ = -(ushort)(auVar21._6_2_ == 0);
    auVar18._8_2_ = -(ushort)(auVar21._8_2_ == 0);
    auVar18._10_2_ = -(ushort)(auVar21._10_2_ == 0);
    auVar18._12_2_ = -(ushort)(auVar21._12_2_ == 0);
    auVar18._14_2_ = -(ushort)(auVar21._14_2_ == 0);
    iVar12 = -1;
    if (iVar16 == 0) {
      iVar16 = iVar12;
    }
    uVar14 = movmskps(iVar13,auVar18);
    if ((uVar14 & 8) != 0) {
      iVar16 = iVar12;
    }
    iVar13 = QVar7.ht.m_i.m_i - iVar17;
    if (iVar13 == 0) {
      iVar13 = iVar12;
    }
    if ((uVar14 & 4) != 0) {
      iVar13 = iVar12;
    }
    if ((uVar14 & 2) != 0) {
      iVar11 = 0xffffff;
    }
    iVar12 = QVar8.ht.m_i.m_i - iVar17;
    if ((uVar14 & 1) != 0) {
      iVar12 = 0xffffff;
    }
  }
  if (0xfffffe < RVar15.m_i) {
    RVar15.m_i = 0xffffff;
  }
  if (iVar4 < 0) {
    RVar15.m_i = iVar9;
  }
  RVar10.m_i = 0xffffff;
  if (local_40 < 0xffffff) {
    RVar10.m_i = local_40;
  }
  if (iVar3 < 0) {
    RVar10.m_i = iVar9;
  }
  if (iVar11 <= RVar10.m_i) {
    RVar10.m_i = iVar11;
  }
  if (iVar12 <= RVar15.m_i) {
    RVar15.m_i = iVar12;
  }
  if (RVar10.m_i <= iVar16) {
    RVar10.m_i = iVar16;
  }
  if (RVar15.m_i <= iVar13) {
    RVar15.m_i = iVar13;
  }
  QVar7.ht.m_i = RVar15.m_i;
  QVar7.wd.m_i = RVar10.m_i;
  return QVar7;
}

Assistant:

QSize QDockWidgetLayout::sizeFromContent(const QSize &content, bool floating) const
{
    QSize result = content;

    if (verticalTitleBar) {
        result.setHeight(qMax(result.height(), minimumTitleWidth()));
        result.setWidth(qMax(content.width(), 0));
    } else {
        result.setHeight(qMax(result.height(), 0));
        result.setWidth(qMax(content.width(), minimumTitleWidth()));
    }

    QDockWidget *w = qobject_cast<QDockWidget*>(parentWidget());
    const bool nativeDeco = nativeWindowDeco(floating);

    int fw = floating && !nativeDeco
            ? w->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, w)
            : 0;

    const int th = titleHeight();
    if (!nativeDeco) {
        if (verticalTitleBar)
            result += QSize(th + 2*fw, 2*fw);
        else
            result += QSize(2*fw, th + 2*fw);
    }

    result.setHeight(qMin(result.height(), (int) QWIDGETSIZE_MAX));
    result.setWidth(qMin(result.width(), (int) QWIDGETSIZE_MAX));

    if (content.width() < 0)
        result.setWidth(-1);
    if (content.height() < 0)
        result.setHeight(-1);

    const QMargins margins = w->contentsMargins();
    //we need to subtract the contents margin (it will be added by the caller)
    QSize min = w->minimumSize().shrunkBy(margins);
    QSize max = w->maximumSize().shrunkBy(margins);

    /* A floating dockwidget will automatically get its minimumSize set to the layout's
       minimum size + deco. We're *not* interested in this, we only take minimumSize()
       into account if the user set it herself. Otherwise we end up expanding the result
       of a calculation for a non-floating dock widget to a floating dock widget's
       minimum size + window decorations. */

    uint explicitMin = 0;
    uint explicitMax = 0;
    if (w->d_func()->extra != nullptr) {
        explicitMin = w->d_func()->extra->explicitMinSize;
        explicitMax = w->d_func()->extra->explicitMaxSize;
    }

    if (!(explicitMin & Qt::Horizontal) || min.width() == 0)
        min.setWidth(-1);
    if (!(explicitMin & Qt::Vertical) || min.height() == 0)
        min.setHeight(-1);

    if (!(explicitMax & Qt::Horizontal))
        max.setWidth(QWIDGETSIZE_MAX);
    if (!(explicitMax & Qt::Vertical))
        max.setHeight(QWIDGETSIZE_MAX);

    return result.boundedTo(max).expandedTo(min);
}